

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_write(connectdata *conn,curl_socket_t sockfd,void *mem,size_t len,ssize_t *written)

{
  CURLcode CVar1;
  ssize_t sVar2;
  bool bVar3;
  CURLcode curlcode;
  CURLcode local_c;
  
  local_c = CURLE_OK;
  bVar3 = conn->sock[1] == sockfd;
  sVar2 = (*conn->send[bVar3])(conn,(uint)bVar3,mem,len,&local_c);
  *written = sVar2;
  CVar1 = CURLE_OK;
  if (sVar2 < 0) {
    if (local_c == CURLE_OK) {
      CVar1 = CURLE_SEND_ERROR;
    }
    else {
      CVar1 = local_c;
      if (local_c == CURLE_AGAIN) {
        *written = 0;
        CVar1 = CURLE_OK;
      }
    }
  }
  return CVar1;
}

Assistant:

CURLcode Curl_write(struct connectdata *conn,
                    curl_socket_t sockfd,
                    const void *mem,
                    size_t len,
                    ssize_t *written)
{
  ssize_t bytes_written;
  CURLcode curlcode = CURLE_OK;
  int num = (sockfd == conn->sock[SECONDARYSOCKET]);

  bytes_written = conn->send[num](conn, num, mem, len, &curlcode);

  *written = bytes_written;
  if(bytes_written >= 0)
    /* we completely ignore the curlcode value when subzero is not returned */
    return CURLE_OK;

  /* handle CURLE_AGAIN or a send failure */
  switch(curlcode) {
  case CURLE_AGAIN:
    *written = 0;
    return CURLE_OK;

  case CURLE_OK:
    /* general send failure */
    return CURLE_SEND_ERROR;

  default:
    /* we got a specific curlcode, forward it */
    return curlcode;
  }
}